

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O3

void __thiscall
Assimp::FBX::FBXConverter::ConvertWeights
          (FBXConverter *this,aiMesh *out,Model *model,MeshGeometry *geo,
          aiMatrix4x4 *absolute_transform,aiNode *parent,aiNode *root_node,uint materialIndex,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *outputVertStartIndices)

{
  aiBone *paVar1;
  pointer ppaVar2;
  uint *puVar3;
  uint uVar4;
  Skin *pSVar5;
  MatIndexArray *pMVar6;
  uint *puVar7;
  aiBone **__s;
  uint *puVar8;
  ulong uVar9;
  pointer ppaVar10;
  ulong uVar11;
  uint *puVar12;
  ulong uVar13;
  pointer ppCVar14;
  uint count;
  vector<unsigned_long,_std::allocator<unsigned_long>_> index_out_indices;
  vector<unsigned_long,_std::allocator<unsigned_long>_> out_indices;
  vector<unsigned_long,_std::allocator<unsigned_long>_> count_out_indices;
  size_t no_index_sentinel;
  vector<aiBone_*,_std::allocator<aiBone_*>_> bones;
  aiNode *in_stack_fffffffffffffef0;
  aiNode *in_stack_fffffffffffffef8;
  uint local_f4;
  unsigned_long local_f0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_e8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_c8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_a8;
  unsigned_long local_90;
  vector<aiBone_*,_std::allocator<aiBone_*>_> local_88;
  aiMesh *local_70;
  FBXConverter *local_68;
  Cluster *local_60;
  pointer local_58;
  aiMatrix4x4 *local_50;
  pointer local_48;
  uint *local_40;
  uint *local_38;
  
  local_68 = this;
  local_50 = absolute_transform;
  pSVar5 = Geometry::DeformerSkin(&geo->super_Geometry);
  if (pSVar5 == (Skin *)0x0) {
    __assert_fail("geo.DeformerSkin()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXConverter.cpp"
                  ,0x5d3,
                  "void Assimp::FBX::FBXConverter::ConvertWeights(aiMesh *, const Model &, const MeshGeometry &, const aiMatrix4x4 &, aiNode *, aiNode *, unsigned int, std::vector<unsigned int> *)"
                 );
  }
  local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (unsigned_long *)0x0;
  local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pSVar5 = Geometry::DeformerSkin(&geo->super_Geometry);
  local_88.super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_88.super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_88.super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_70 = out;
  if (outputVertStartIndices == (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0 &&
      materialIndex != 0xffffffff) {
    __assert_fail("no_mat_check || outputVertStartIndices",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXConverter.cpp"
                  ,0x5de,
                  "void Assimp::FBX::FBXConverter::ConvertWeights(aiMesh *, const Model &, const MeshGeometry &, const aiMatrix4x4 &, aiNode *, aiNode *, unsigned int, std::vector<unsigned int> *)"
                 );
  }
  ppCVar14 = (pSVar5->clusters).
             super__Vector_base<const_Assimp::FBX::Cluster_*,_std::allocator<const_Assimp::FBX::Cluster_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_58 = (pSVar5->clusters).
             super__Vector_base<const_Assimp::FBX::Cluster_*,_std::allocator<const_Assimp::FBX::Cluster_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (ppCVar14 != local_58) {
    do {
      local_60 = *ppCVar14;
      if (local_60 == (Cluster *)0x0) {
        __assert_fail("cluster",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXConverter.cpp"
                      ,0x5e3,
                      "void Assimp::FBX::FBXConverter::ConvertWeights(aiMesh *, const Model &, const MeshGeometry &, const aiMatrix4x4 &, aiNode *, aiNode *, unsigned int, std::vector<unsigned int> *)"
                     );
      }
      pMVar6 = MeshGeometry::GetMaterialIndices(geo);
      local_90 = 0xffffffffffffffff;
      if (local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start) {
        local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
      }
      if (local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start) {
        local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
      }
      if (local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start) {
        local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
      }
      puVar12 = (local_60->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start;
      local_40 = (local_60->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      local_48 = ppCVar14;
      if (puVar12 != local_40) {
        do {
          local_f4 = 0;
          puVar7 = MeshGeometry::ToOutputVertexIndex(geo,*puVar12,&local_f4);
          if (puVar7 == (uint *)0x0) {
            __assert_fail("out_idx != nullptr",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXConverter.cpp"
                          ,0x5f8,
                          "void Assimp::FBX::FBXConverter::ConvertWeights(aiMesh *, const Model &, const MeshGeometry &, const aiMatrix4x4 &, aiNode *, aiNode *, unsigned int, std::vector<unsigned int> *)"
                         );
          }
          if (local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_e8,
                       (iterator)
                       local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish,&local_90);
          }
          else {
            *local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish = local_90;
            local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          local_f0 = 0;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                    (&local_a8,&local_f0);
          local_38 = puVar12;
          if (local_f4 != 0) {
            uVar13 = 0;
            do {
              if ((materialIndex == 0xffffffff) ||
                 (uVar4 = MeshGeometry::FaceForVertexIndex(geo,puVar7[uVar13]),
                 (long)(pMVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start[uVar4] == (ulong)materialIndex)) {
                if (local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish[-1] == 0xffffffffffffffff) {
                  local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_finish[-1] =
                       (long)local_c8.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_c8.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 3;
                }
                if (materialIndex == 0xffffffff) {
                  local_f0 = (unsigned_long)puVar7[uVar13];
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                  emplace_back<unsigned_long>(&local_c8,&local_f0);
                }
                else {
                  puVar12 = (outputVertStartIndices->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_start;
                  uVar9 = (long)(outputVertStartIndices->
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                _M_impl.super__Vector_impl_data._M_finish - (long)puVar12 >> 2;
                  puVar8 = puVar12;
                  if (0 < (long)uVar9) {
                    do {
                      uVar11 = uVar9 >> 1;
                      uVar9 = ~uVar11 + uVar9;
                      puVar3 = puVar8 + uVar11 + 1;
                      if (puVar7[uVar13] <= puVar8[uVar11]) {
                        uVar9 = uVar11;
                        puVar3 = puVar8;
                      }
                      puVar8 = puVar3;
                    } while (0 < (long)uVar9);
                  }
                  local_f0 = (long)puVar8 - (long)puVar12 >> 2;
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                  emplace_back<unsigned_long>(&local_c8,&local_f0);
                }
                local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish[-1] =
                     local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish[-1] + 1;
              }
              uVar13 = uVar13 + 1;
            } while (uVar13 < local_f4);
          }
          puVar12 = local_38 + 1;
        } while (puVar12 != local_40);
      }
      ConvertCluster(local_68,&local_88,local_60,&local_c8,&local_e8,&local_a8,local_50,
                     in_stack_fffffffffffffef0,in_stack_fffffffffffffef8);
      ppCVar14 = local_48 + 1;
    } while (ppCVar14 != local_58);
  }
  std::
  _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiBone_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiBone_*>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiBone_*>_>_>
  ::clear(&(local_68->bone_map)._M_t);
  ppaVar2 = local_88.super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  ppaVar10 = local_88.super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (local_88.super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_88.super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_70->mBones = (aiBone **)0x0;
    local_70->mNumBones = 0;
  }
  else {
    uVar13 = (long)local_88.super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_88.super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3;
    uVar9 = -(ulong)(uVar13 >> 0x3d != 0) |
            (long)local_88.super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_88.super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
    __s = (aiBone **)operator_new__(uVar9);
    memset(__s,0,uVar9);
    local_70->mBones = __s;
    local_70->mNumBones = (uint)uVar13;
    do {
      paVar1 = *ppaVar10;
      *ppaVar10 = *__s;
      *__s = paVar1;
      ppaVar10 = ppaVar10 + 1;
      __s = __s + 1;
    } while (ppaVar10 != ppaVar2);
  }
  if (local_88.super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
    operator_delete(local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void FBXConverter::ConvertWeights(aiMesh *out, const Model &model, const MeshGeometry &geo,
                                          const aiMatrix4x4 &absolute_transform,
                                          aiNode *parent, aiNode *root_node, unsigned int materialIndex,
                                          std::vector<unsigned int> *outputVertStartIndices)
        {
            ai_assert(geo.DeformerSkin());

            std::vector<size_t> out_indices;
            std::vector<size_t> index_out_indices;
            std::vector<size_t> count_out_indices;

            const Skin& sk = *geo.DeformerSkin();

            std::vector<aiBone*> bones;

            const bool no_mat_check = materialIndex == NO_MATERIAL_SEPARATION;
            ai_assert(no_mat_check || outputVertStartIndices);

            try {
                // iterate over the sub deformers
                for (const Cluster* cluster : sk.Clusters()) {
                    ai_assert(cluster);

                    const WeightIndexArray& indices = cluster->GetIndices();

                    const MatIndexArray& mats = geo.GetMaterialIndices();

                    const size_t no_index_sentinel = std::numeric_limits<size_t>::max();

                    count_out_indices.clear();
                    index_out_indices.clear();
                    out_indices.clear();


                    // now check if *any* of these weights is contained in the output mesh,
                    // taking notes so we don't need to do it twice.
                    for (WeightIndexArray::value_type index : indices) {

                        unsigned int count = 0;
                        const unsigned int* const out_idx = geo.ToOutputVertexIndex(index, count);
                        // ToOutputVertexIndex only returns nullptr if index is out of bounds
                        // which should never happen
                        ai_assert(out_idx != nullptr);

                        index_out_indices.push_back(no_index_sentinel);
                        count_out_indices.push_back(0);

                        for (unsigned int i = 0; i < count; ++i) {
                            if (no_mat_check || static_cast<size_t>(mats[geo.FaceForVertexIndex(out_idx[i])]) == materialIndex) {

                                if (index_out_indices.back() == no_index_sentinel) {
                                    index_out_indices.back() = out_indices.size();
                                }

                                if (no_mat_check) {
                                    out_indices.push_back(out_idx[i]);
                                } else {
                                    // this extra lookup is in O(logn), so the entire algorithm becomes O(nlogn)
                                    const std::vector<unsigned int>::iterator it = std::lower_bound(
                                        outputVertStartIndices->begin(),
                                        outputVertStartIndices->end(),
                                        out_idx[i]
                                    );

                                    out_indices.push_back(std::distance(outputVertStartIndices->begin(), it));
                                }

                                ++count_out_indices.back();                               
                            }
                        }
                    }

                    // if we found at least one, generate the output bones
                    // XXX this could be heavily simplified by collecting the bone
                    // data in a single step.
                    ConvertCluster(bones, cluster, out_indices, index_out_indices,
                                   count_out_indices, absolute_transform, parent, root_node);
                }

                bone_map.clear();
            }
            catch (std::exception&e) {
                std::for_each(bones.begin(), bones.end(), Util::delete_fun<aiBone>());
                throw;
            }

            if (bones.empty()) {
                out->mBones = nullptr;
                out->mNumBones = 0;
                return;
            } else {
                out->mBones = new aiBone *[bones.size()]();
                out->mNumBones = static_cast<unsigned int>(bones.size());

                std::swap_ranges(bones.begin(), bones.end(), out->mBones);
            }
        }